

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.hpp
# Opt level: O3

number_validator<float> __thiscall
goodform::number_validator<float>::lte(number_validator<float> *this,float less_or_equal_to)

{
  long *plVar1;
  error_message *peVar2;
  size_type *psVar3;
  long *in_RSI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 in_XMM0_Db;
  undefined8 uVar4;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  float fVar5;
  number_validator<float> nVar6;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  error_message local_40;
  
  fVar5 = *(float *)(in_RSI + 1);
  peVar2 = (error_message *)*in_RSI;
  uVar4 = CONCAT44(in_XMM0_Db,less_or_equal_to);
  if ((less_or_equal_to < fVar5) &&
     (uVar4 = CONCAT44(in_XMM0_Db,less_or_equal_to), (peVar2->message_)._M_string_length == 0)) {
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              (&local_60,vsnprintf,0x3a,"%f",SUB84((double)less_or_equal_to,0));
    plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x132c86);
    psVar3 = (size_type *)(plVar1 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar1 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar3) {
      local_80.field_2._M_allocated_capacity = *psVar3;
      local_80.field_2._8_8_ = plVar1[3];
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    }
    else {
      local_80.field_2._M_allocated_capacity = *psVar3;
      local_80._M_dataplus._M_p = (pointer)*plVar1;
    }
    local_80._M_string_length = plVar1[1];
    *plVar1 = (long)psVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    error_message::error_message(&local_40,&local_80);
    uVar4 = std::__cxx11::string::operator=((string *)*in_RSI,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.message_._M_dataplus._M_p != &local_40.message_.field_2) {
      operator_delete(local_40.message_._M_dataplus._M_p,
                      local_40.message_.field_2._M_allocated_capacity + 1);
      uVar4 = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      uVar4 = CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      uVar4 = CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
    }
    peVar2 = (error_message *)*in_RSI;
    fVar5 = *(float *)(in_RSI + 1);
  }
  this->error_ = peVar2;
  this->value_ = fVar5;
  nVar6._8_8_ = uVar4;
  nVar6.error_ = (error_message *)this;
  return nVar6;
}

Assistant:

number_validator<N> number_validator<N>::lte(N less_or_equal_to)
  {
    if (this->value_ > less_or_equal_to && this->error_.empty())
      this->error_ = "VALUE MUST BE LESS THAN OR EQUAL TO " + std::to_string(less_or_equal_to);
    number_validator<N> ret(*this);
    return ret;
  }